

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::MeshLoader::initializeBinormalsOffset(MeshLoader *this)

{
  uint uVar1;
  InputShared *pIVar2;
  SourceBase *pSVar3;
  bool bVar4;
  
  pIVar2 = MeshPrimitiveInputList::getBinormalInput(&this->mMeshPrimitiveInputs);
  if (pIVar2 != (InputShared *)0x0) {
    this->mBinormalsOffset = pIVar2->mOffset;
    pSVar3 = SourceArrayLoader::getSourceById
                       (&this->super_SourceArrayLoader,
                        &(pIVar2->super_InputUnshared).mSource.mFragment);
    if (pSVar3 != (SourceBase *)0x0) {
      uVar1 = 0;
      bVar4 = false;
      if (pSVar3->mStride == 3) {
        uVar1 = (uint)(pSVar3->mInitialIndex / 3);
        bVar4 = true;
      }
      goto LAB_0083d57c;
    }
  }
  uVar1 = 0;
  bVar4 = false;
LAB_0083d57c:
  this->mBinormalsIndexOffset = uVar1;
  this->mUseBinormals = bVar4;
  return;
}

Assistant:

void MeshLoader::initializeBinormalsOffset ()
    {
        // Check for using normals
        const InputShared* binormalInput = mMeshPrimitiveInputs.getBinormalInput ();
        if ( binormalInput != 0 ) 
        {
            // Get the offset value, the initial index values and alloc the memory.
            mBinormalsOffset = binormalInput->getOffset ();
            const SourceBase* sourceBase = getSourceById ( binormalInput->getSource ().getFragment () );
            if ( !sourceBase )
            {
                mBinormalsIndexOffset = 0;
                mUseBinormals = false;
            }
            else 
            {
                // only stride 3 makes sense for normals
                unsigned long long stride = sourceBase->getStride();
                if ( stride == 3 )
                {
                    mBinormalsIndexOffset = (unsigned int)(sourceBase->getInitialIndex() / stride);
                    mUseBinormals = true;
                }
                else
                {
                    mBinormalsIndexOffset = 0;
                    mUseBinormals = false;
                }
            }
        }
        else
        {
            mBinormalsIndexOffset = 0;
            mUseBinormals = false;
        }
    }